

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  uint32 tag;
  undefined4 extraout_var;
  FieldDescriptor *field;
  uint32 tag_00;
  uint32 length;
  string message_data;
  StringOutputStream output_stream;
  string temp;
  CodedOutputStream coded_output;
  uint32 local_dc;
  string local_d8;
  StringOutputStream local_b8;
  undefined1 local_a8 [16];
  ArrayInputStream AStack_98;
  undefined8 uStack_78;
  int local_70;
  int local_6c;
  DescriptorPool *local_68;
  MessageFactory *pMStack_60;
  long *local_58;
  ArrayInputStream local_50;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  local_58 = (long *)CONCAT44(extraout_var,iVar4);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  tag_00 = 0;
  field = (FieldDescriptor *)0x0;
LAB_0022728c:
  do {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (tag = (uint32)(char)*puVar2, -1 < (char)*puVar2)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar2 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if ((int)tag < 0x1a) {
      if (tag == 0) goto LAB_00227528;
      if (tag == 0xc) {
        tag_00 = 1;
        goto LAB_0022752b;
      }
      if (tag == 0x10) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          local_b8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream._0_4_ = (int)(char)uVar1;
        }
        else {
          bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_b8);
          if (!bVar3) goto LAB_00227528;
        }
        iVar4 = (int)local_b8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
        field = (FieldDescriptor *)
                (**(code **)(*local_58 + 0x218))
                          (local_58,(int)local_b8.super_ZeroCopyOutputStream.
                                         _vptr_ZeroCopyOutputStream);
        tag_00 = iVar4 * 8 + 2;
        if (local_d8._M_string_length != 0) {
          io::ArrayInputStream::ArrayInputStream
                    (&local_50,local_d8._M_dataplus._M_p,(int)local_d8._M_string_length,-1);
          AStack_98.data_._0_6_ = 0;
          AStack_98._14_8_ = 0;
          local_a8._8_8_ = (uint8 *)0x0;
          AStack_98.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ = '\0';
          AStack_98.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._1_5_ = 0;
          AStack_98.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._6_2_ = 0;
          AStack_98.position_ = 0x7fffffff;
          AStack_98.last_returned_size_ = 0;
          uStack_78._0_4_ = 0x4000000;
          uStack_78._4_4_ = 0x2000000;
          local_70 = 0;
          local_6c = io::CodedInputStream::default_recursion_limit_;
          local_68 = (DescriptorPool *)0x0;
          pMStack_60 = (MessageFactory *)0x0;
          local_a8._0_8_ = &local_50;
          io::CodedInputStream::Refresh((CodedInputStream *)local_a8);
          bVar3 = ParseAndMergeField(tag_00,field,message,(CodedInputStream *)local_a8);
          if (!bVar3) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_a8);
            io::ArrayInputStream::~ArrayInputStream(&local_50);
            goto LAB_00227528;
          }
          local_d8._M_string_length = 0;
          *local_d8._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_a8);
          io::ArrayInputStream::~ArrayInputStream(&local_50);
        }
        goto LAB_0022728c;
      }
LAB_002272ee:
      bVar3 = SkipField(input,tag,(UnknownFieldSet *)0x0);
    }
    else {
      if (tag != 0x1a) goto LAB_002272ee;
      if (tag_00 == 0) {
        local_a8._0_8_ = &AStack_98;
        local_a8._8_8_ = (uint8 *)0x0;
        AStack_98.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ = '\0';
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          local_dc = (int)(char)uVar1;
LAB_00227466:
          bVar3 = io::CodedInputStream::ReadString(input,(string *)local_a8,local_dc);
          if (!bVar3) goto LAB_002274d3;
          io::StringOutputStream::StringOutputStream(&local_b8,&local_d8);
          io::CodedOutputStream::CodedOutputStream
                    ((CodedOutputStream *)&local_50,&local_b8.super_ZeroCopyOutputStream);
          io::CodedOutputStream::WriteVarint32((CodedOutputStream *)&local_50,local_dc);
          io::CodedOutputStream::WriteRaw
                    ((CodedOutputStream *)&local_50,(void *)local_a8._0_8_,local_a8._8_4_);
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_50);
          io::StringOutputStream::~StringOutputStream(&local_b8);
          bVar3 = true;
        }
        else {
          bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_dc);
          if (bVar3) goto LAB_00227466;
LAB_002274d3:
          bVar3 = false;
        }
        if ((ArrayInputStream *)local_a8._0_8_ != &AStack_98) {
          operator_delete((void *)local_a8._0_8_,
                          CONCAT26(AStack_98.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream.
                                   _6_2_,CONCAT51(AStack_98.super_ZeroCopyInputStream.
                                                  _vptr_ZeroCopyInputStream._1_5_,
                                                  AStack_98.super_ZeroCopyInputStream.
                                                  _vptr_ZeroCopyInputStream._0_1_)) + 1);
        }
        tag_00 = 0;
        if (!bVar3) goto LAB_0022752b;
        goto LAB_0022728c;
      }
      bVar3 = ParseAndMergeField(tag_00,field,message,input);
    }
    if (bVar3 == false) {
LAB_00227528:
      tag_00 = 0;
LAB_0022752b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      return SUB41(tag_00,0);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(
            type_id, WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeField(fake_tag, field, message,
                                  &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeField(fake_tag, field, message, input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}